

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int parseModifier(sqlite3_context *pCtx,char *z,int n,DateTime *p)

{
  int iVar1;
  sqlite3_int64 sVar2;
  sqlite3_int64 sVar3;
  char *z_00;
  bool bVar4;
  int local_c4;
  int y;
  int x;
  sqlite3_int64 day;
  DateTime tx;
  char *z2;
  int i;
  double rRounder;
  sqlite3_int64 Z;
  sqlite3_int64 c1;
  double r;
  DateTime *pDStack_28;
  int rc;
  DateTime *p_local;
  byte *pbStack_18;
  int n_local;
  char *z_local;
  sqlite3_context *pCtx_local;
  
  r._4_4_ = 1;
  pDStack_28 = p;
  p_local._4_4_ = n;
  pbStack_18 = (byte *)z;
  z_local = (char *)pCtx;
  switch(""[(byte)*z]) {
  case '+':
  case '-':
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    p_local._4_4_ = 1;
    while( true ) {
      bVar4 = false;
      if ((z[(int)p_local._4_4_] != '\0') && (bVar4 = false, z[(int)p_local._4_4_] != ':')) {
        bVar4 = (""[(byte)z[(int)p_local._4_4_]] & 1) == 0;
      }
      if (!bVar4) break;
      p_local._4_4_ = p_local._4_4_ + 1;
    }
    iVar1 = sqlite3AtoF(z,(double *)&c1,p_local._4_4_,'\x01');
    if (iVar1 == 0) {
      r._4_4_ = 1;
    }
    else if (pbStack_18[(int)p_local._4_4_] == 0x3a) {
      tx._40_8_ = pbStack_18;
      if ((""[*pbStack_18] & 4) == 0) {
        tx._40_8_ = pbStack_18 + 1;
      }
      memset(&day,0,0x30);
      iVar1 = parseHhMmSs((char *)tx._40_8_,(DateTime *)&day);
      if (iVar1 == 0) {
        computeJD((DateTime *)&day);
        day = (day + -43200000) % 86400000;
        if (*pbStack_18 == 0x2d) {
          day = -day;
        }
        computeJD(pDStack_28);
        clearYMD_HMS_TZ(pDStack_28);
        pDStack_28->iJD = day + pDStack_28->iJD;
        r._4_4_ = 0;
      }
    }
    else {
      pbStack_18 = pbStack_18 + (int)p_local._4_4_;
      while ((""[*pbStack_18] & 1) != 0) {
        pbStack_18 = pbStack_18 + 1;
      }
      p_local._4_4_ = sqlite3Strlen30((char *)pbStack_18);
      if (((int)p_local._4_4_ < 0xb) && (2 < (int)p_local._4_4_)) {
        if (""[pbStack_18[(int)(p_local._4_4_ - 1)]] == 's') {
          p_local._4_4_ = p_local._4_4_ - 1;
        }
        computeJD(pDStack_28);
        r._4_4_ = 1;
        bVar4 = (double)c1 < 0.0;
        for (z2._4_4_ = 0; z2._4_4_ < 6; z2._4_4_ = z2._4_4_ + 1) {
          if ((((aXformType[z2._4_4_].nName == p_local._4_4_) &&
               (iVar1 = sqlite3_strnicmp(aXformType[z2._4_4_].zName,(char *)pbStack_18,p_local._4_4_
                                        ), iVar1 == 0)) &&
              (-aXformType[z2._4_4_].rLimit < (double)c1)) &&
             ((double)c1 < aXformType[z2._4_4_].rLimit)) {
            if (aXformType[z2._4_4_].eType == '\x01') {
              computeYMD_HMS(pDStack_28);
              pDStack_28->M = (int)(double)c1 + pDStack_28->M;
              if (pDStack_28->M < 1) {
                local_c4 = pDStack_28->M + -0xc;
              }
              else {
                local_c4 = pDStack_28->M + -1;
              }
              local_c4 = local_c4 / 0xc;
              pDStack_28->Y = local_c4 + pDStack_28->Y;
              pDStack_28->M = pDStack_28->M + local_c4 * -0xc;
              pDStack_28->validJD = '\0';
              c1 = (sqlite3_int64)((double)c1 - (double)(int)(double)c1);
            }
            else if (aXformType[z2._4_4_].eType == '\x02') {
              iVar1 = (int)(double)c1;
              computeYMD_HMS(pDStack_28);
              pDStack_28->Y = iVar1 + pDStack_28->Y;
              pDStack_28->validJD = '\0';
              c1 = (sqlite3_int64)((double)c1 - (double)(int)(double)c1);
            }
            computeJD(pDStack_28);
            pDStack_28->iJD =
                 (long)((double)c1 * aXformType[z2._4_4_].rXform +
                       (double)(~-(ulong)bVar4 & 0x3fe0000000000000 |
                               -(ulong)bVar4 & 0xbfe0000000000000)) + pDStack_28->iJD;
            r._4_4_ = 0;
            break;
          }
        }
        clearYMD_HMS_TZ(pDStack_28);
      }
    }
    break;
  default:
    break;
  case 'l':
    iVar1 = sqlite3_stricmp(z,"localtime");
    if (iVar1 == 0) {
      computeJD(pDStack_28);
      sVar2 = localtimeOffset(pDStack_28,(sqlite3_context *)z_local,(int *)((long)&r + 4));
      pDStack_28->iJD = sVar2 + pDStack_28->iJD;
      clearYMD_HMS_TZ(pDStack_28);
    }
    break;
  case 's':
    iVar1 = sqlite3_strnicmp(z,"start of ",9);
    if (iVar1 == 0) {
      pbStack_18 = (byte *)((char *)pbStack_18 + 9);
      computeYMD(pDStack_28);
      pDStack_28->validHMS = '\x01';
      pDStack_28->m = 0;
      pDStack_28->h = 0;
      pDStack_28->s = 0.0;
      pDStack_28->validTZ = '\0';
      pDStack_28->validJD = '\0';
      iVar1 = sqlite3_stricmp((char *)pbStack_18,"month");
      if (iVar1 == 0) {
        pDStack_28->D = 1;
        r._4_4_ = 0;
      }
      else {
        iVar1 = sqlite3_stricmp((char *)pbStack_18,"year");
        if (iVar1 == 0) {
          computeYMD(pDStack_28);
          pDStack_28->M = 1;
          pDStack_28->D = 1;
          r._4_4_ = 0;
        }
        else {
          iVar1 = sqlite3_stricmp((char *)pbStack_18,"day");
          if (iVar1 == 0) {
            r._4_4_ = 0;
          }
        }
      }
    }
    break;
  case 'u':
    iVar1 = sqlite3_stricmp(z,"unixepoch");
    if ((iVar1 == 0) && (pDStack_28->rawS != '\0')) {
      c1 = (sqlite3_int64)(pDStack_28->s * 1000.0 + 210866760000000.0);
      if ((0.0 <= (double)c1) && ((double)c1 < 464269060800000.0)) {
        clearYMD_HMS_TZ(pDStack_28);
        pDStack_28->iJD = (long)(double)c1;
        pDStack_28->validJD = '\x01';
        pDStack_28->rawS = '\0';
        r._4_4_ = 0;
      }
    }
    else {
      iVar1 = sqlite3_stricmp((char *)pbStack_18,"utc");
      if (iVar1 == 0) {
        if (pDStack_28->tzSet == '\0') {
          computeJD(pDStack_28);
          sVar2 = localtimeOffset(pDStack_28,(sqlite3_context *)z_local,(int *)((long)&r + 4));
          if (r._4_4_ == 0) {
            pDStack_28->iJD = pDStack_28->iJD - sVar2;
            clearYMD_HMS_TZ(pDStack_28);
            sVar3 = localtimeOffset(pDStack_28,(sqlite3_context *)z_local,(int *)((long)&r + 4));
            pDStack_28->iJD = (sVar2 - sVar3) + pDStack_28->iJD;
          }
          pDStack_28->tzSet = '\x01';
        }
        else {
          r._4_4_ = 0;
        }
      }
    }
    break;
  case 'w':
    iVar1 = sqlite3_strnicmp(z,"weekday ",8);
    if (iVar1 == 0) {
      z_00 = (char *)pbStack_18 + 8;
      iVar1 = sqlite3Strlen30((char *)pbStack_18 + 8);
      iVar1 = sqlite3AtoF(z_00,(double *)&c1,iVar1,'\x01');
      if (iVar1 != 0) {
        p_local._4_4_ = (uint)(double)c1;
        if (((((double)(int)p_local._4_4_ == (double)c1) &&
             (!NAN((double)(int)p_local._4_4_) && !NAN((double)c1))) && (-1 < (int)p_local._4_4_))
           && ((double)c1 < 7.0)) {
          computeYMD_HMS(pDStack_28);
          pDStack_28->validTZ = '\0';
          pDStack_28->validJD = '\0';
          computeJD(pDStack_28);
          rRounder = (double)(((pDStack_28->iJD + 0x7b98a00) / 86400000) % 7);
          if ((long)(int)p_local._4_4_ < (long)rRounder) {
            rRounder = (double)((long)rRounder + -7);
          }
          pDStack_28->iJD = ((long)(int)p_local._4_4_ - (long)rRounder) * 86400000 + pDStack_28->iJD
          ;
          clearYMD_HMS_TZ(pDStack_28);
          r._4_4_ = 0;
        }
      }
    }
  }
  return r._4_4_;
}

Assistant:

static int parseModifier(
  sqlite3_context *pCtx,      /* Function context */
  const char *z,              /* The text of the modifier */
  int n,                      /* Length of zMod in bytes */
  DateTime *p                 /* The date/time value to be modified */
){
  int rc = 1;
  double r;
  switch(sqlite3UpperToLower[(u8)z[0]] ){
#ifndef SQLITE_OMIT_LOCALTIME
    case 'l': {
      /*    localtime
      **
      ** Assuming the current time value is UTC (a.k.a. GMT), shift it to
      ** show local time.
      */
      if( sqlite3_stricmp(z, "localtime")==0 ){
        computeJD(p);
        p->iJD += localtimeOffset(p, pCtx, &rc);
        clearYMD_HMS_TZ(p);
      }
      break;
    }
#endif
    case 'u': {
      /*
      **    unixepoch
      **
      ** Treat the current value of p->s as the number of
      ** seconds since 1970.  Convert to a real julian day number.
      */
      if( sqlite3_stricmp(z, "unixepoch")==0 && p->rawS ){
        r = p->s*1000.0 + 210866760000000.0;
        if( r>=0.0 && r<464269060800000.0 ){
          clearYMD_HMS_TZ(p);
          p->iJD = (sqlite3_int64)r;
          p->validJD = 1;
          p->rawS = 0;
          rc = 0;
        }
      }
#ifndef SQLITE_OMIT_LOCALTIME
      else if( sqlite3_stricmp(z, "utc")==0 ){
        if( p->tzSet==0 ){
          sqlite3_int64 c1;
          computeJD(p);
          c1 = localtimeOffset(p, pCtx, &rc);
          if( rc==SQLITE_OK ){
            p->iJD -= c1;
            clearYMD_HMS_TZ(p);
            p->iJD += c1 - localtimeOffset(p, pCtx, &rc);
          }
          p->tzSet = 1;
        }else{
          rc = SQLITE_OK;
        }
      }
#endif
      break;
    }
    case 'w': {
      /*
      **    weekday N
      **
      ** Move the date to the same time on the next occurrence of
      ** weekday N where 0==Sunday, 1==Monday, and so forth.  If the
      ** date is already on the appropriate weekday, this is a no-op.
      */
      if( sqlite3_strnicmp(z, "weekday ", 8)==0
               && sqlite3AtoF(&z[8], &r, sqlite3Strlen30(&z[8]), SQLITE_UTF8)
               && (n=(int)r)==r && n>=0 && r<7 ){
        sqlite3_int64 Z;
        computeYMD_HMS(p);
        p->validTZ = 0;
        p->validJD = 0;
        computeJD(p);
        Z = ((p->iJD + 129600000)/86400000) % 7;
        if( Z>n ) Z -= 7;
        p->iJD += (n - Z)*86400000;
        clearYMD_HMS_TZ(p);
        rc = 0;
      }
      break;
    }
    case 's': {
      /*
      **    start of TTTTT
      **
      ** Move the date backwards to the beginning of the current day,
      ** or month or year.
      */
      if( sqlite3_strnicmp(z, "start of ", 9)!=0 ) break;
      z += 9;
      computeYMD(p);
      p->validHMS = 1;
      p->h = p->m = 0;
      p->s = 0.0;
      p->validTZ = 0;
      p->validJD = 0;
      if( sqlite3_stricmp(z,"month")==0 ){
        p->D = 1;
        rc = 0;
      }else if( sqlite3_stricmp(z,"year")==0 ){
        computeYMD(p);
        p->M = 1;
        p->D = 1;
        rc = 0;
      }else if( sqlite3_stricmp(z,"day")==0 ){
        rc = 0;
      }
      break;
    }
    case '+':
    case '-':
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9': {
      double rRounder;
      int i;
      for(n=1; z[n] && z[n]!=':' && !sqlite3Isspace(z[n]); n++){}
      if( !sqlite3AtoF(z, &r, n, SQLITE_UTF8) ){
        rc = 1;
        break;
      }
      if( z[n]==':' ){
        /* A modifier of the form (+|-)HH:MM:SS.FFF adds (or subtracts) the
        ** specified number of hours, minutes, seconds, and fractional seconds
        ** to the time.  The ".FFF" may be omitted.  The ":SS.FFF" may be
        ** omitted.
        */
        const char *z2 = z;
        DateTime tx;
        sqlite3_int64 day;
        if( !sqlite3Isdigit(*z2) ) z2++;
        memset(&tx, 0, sizeof(tx));
        if( parseHhMmSs(z2, &tx) ) break;
        computeJD(&tx);
        tx.iJD -= 43200000;
        day = tx.iJD/86400000;
        tx.iJD -= day*86400000;
        if( z[0]=='-' ) tx.iJD = -tx.iJD;
        computeJD(p);
        clearYMD_HMS_TZ(p);
        p->iJD += tx.iJD;
        rc = 0;
        break;
      }

      /* If control reaches this point, it means the transformation is
      ** one of the forms like "+NNN days".  */
      z += n;
      while( sqlite3Isspace(*z) ) z++;
      n = sqlite3Strlen30(z);
      if( n>10 || n<3 ) break;
      if( sqlite3UpperToLower[(u8)z[n-1]]=='s' ) n--;
      computeJD(p);
      rc = 1;
      rRounder = r<0 ? -0.5 : +0.5;
      for(i=0; i<ArraySize(aXformType); i++){
        if( aXformType[i].nName==n
         && sqlite3_strnicmp(aXformType[i].zName, z, n)==0
         && r>-aXformType[i].rLimit && r<aXformType[i].rLimit
        ){
          switch( aXformType[i].eType ){
            case 1: { /* Special processing to add months */
              int x;
              computeYMD_HMS(p);
              p->M += (int)r;
              x = p->M>0 ? (p->M-1)/12 : (p->M-12)/12;
              p->Y += x;
              p->M -= x*12;
              p->validJD = 0;
              r -= (int)r;
              break;
            }
            case 2: { /* Special processing to add years */
              int y = (int)r;
              computeYMD_HMS(p);
              p->Y += y;
              p->validJD = 0;
              r -= (int)r;
              break;
            }
          }
          computeJD(p);
          p->iJD += (sqlite3_int64)(r*aXformType[i].rXform + rRounder);
          rc = 0;
          break;
        }
      }
      clearYMD_HMS_TZ(p);
      break;
    }
    default: {
      break;
    }
  }
  return rc;
}